

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::PhraseTests_HasValue_Test::~PhraseTests_HasValue_Test(PhraseTests_HasValue_Test *this)

{
  PhraseTests_HasValue_Test *this_local;
  
  ~PhraseTests_HasValue_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PhraseTests, HasValue) {
  EXPECT_TRUE(Span{}.empty());
  EXPECT_TRUE(SpanPair{}.empty());
  Span s{1, 1};
  EXPECT_TRUE(s.empty());
  s.end++;
  EXPECT_FALSE(s.empty());
}